

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_input.cpp
# Opt level: O0

void MessagePump(SDL_Event *sev)

{
  Uint32 UVar1;
  char *pcVar2;
  ulong uVar3;
  undefined8 uVar4;
  byte bVar5;
  char cVar6;
  undefined1 uVar7;
  undefined2 uVar8;
  short sVar9;
  int iVar10;
  uchar *puVar11;
  ushort uVar12;
  ushort uVar13;
  BYTE *dik_1;
  BYTE *dik;
  int y_1;
  int x_1;
  event_t event;
  int y;
  int x;
  SDL_Event *sev_local;
  
  y_1._0_1_ = '\0';
  y_1._1_1_ = '\0';
  y_1._2_2_ = 0;
  x_1._0_2_ = 0;
  x_1._2_2_ = 0;
  event.type = '\0';
  event.subtype = '\0';
  event.data1 = 0;
  event.data2 = 0;
  event.data3 = 0;
  UVar1 = sev->type;
  if (UVar1 == 0x100) {
    exit(0);
  }
  if (UVar1 == 0x200) {
    if ((sev->display).event != '\f' && (sev->display).event != '\r') {
      return;
    }
    S_SetSoundPaused((uint)((sev->display).event == '\f'));
    return;
  }
  if (UVar1 - 0x300 < 2) {
    if (!GUICapture) {
      bVar5 = 2;
      if (sev->type == 0x300) {
        bVar5 = 1;
      }
      _y_1 = (ulong)bVar5;
      puVar11 = TMap<int,_unsigned_char,_THashTraits<int>,_TValueTraits<unsigned_char>_>::CheckKey
                          (&KeySymToDIK,(sev->window).data2);
      if (puVar11 == (uchar *)0x0) {
        puVar11 = TMap<SDL_Scancode,_unsigned_char,_THashTraits<SDL_Scancode>,_TValueTraits<unsigned_char>_>
                  ::CheckKey(&KeyScanToDIK,(sev->key).keysym.scancode);
        if (puVar11 != (uchar *)0x0) {
          y_1 = (int)CONCAT12(*puVar11,(ushort)y_1);
        }
      }
      else {
        y_1 = (int)CONCAT12(*puVar11,(ushort)y_1);
      }
      if (y_1._2_2_ == 0) {
        return;
      }
      if ((sev->window).data2 < 0x100) {
        _y_1 = CONCAT24((SWORD)(sev->window).data2,y_1);
      }
      D_PostEvent((event_t *)&y_1);
      return;
    }
    cVar6 = '\x03';
    if (sev->type == 0x300) {
      cVar6 = '\x01';
    }
    y_1._0_2_ = CONCAT11(cVar6,4);
    uVar12 = 0;
    if (((sev->key).keysym.mod & 0xc0) != 0) {
      uVar12 = 2;
    }
    uVar13 = 0;
    if (((sev->key).keysym.mod & 0x300) != 0) {
      uVar13 = 4;
    }
    stack0xffffffffffffffda = 0;
    x_1._2_2_ = ((sev->key).keysym.mod & 3) != 0 | uVar12 | uVar13;
    if (cVar6 == '\x01') {
      if ((DownState[(sev->key).keysym.scancode] & 1U) != 0) {
        y_1._0_2_ = 0x204;
      }
      DownState[(sev->key).keysym.scancode] = true;
    }
    else {
      DownState[(sev->key).keysym.scancode] = false;
    }
    iVar10 = (sev->window).data2;
    if (iVar10 == 0x1b) {
      y_1 = CONCAT22(0x1b,(ushort)y_1);
    }
    else if (iVar10 == 0x7f) {
      y_1 = CONCAT22(0x1a,(ushort)y_1);
    }
    else if (iVar10 == 0x4000003a) {
      y_1 = CONCAT22(0xe,(ushort)y_1);
    }
    else if (iVar10 == 0x4000003b) {
      y_1 = CONCAT22(0xf,(ushort)y_1);
    }
    else if (iVar10 == 0x4000003c) {
      y_1 = CONCAT22(0x10,(ushort)y_1);
    }
    else if (iVar10 == 0x4000003d) {
      y_1 = CONCAT22(0x11,(ushort)y_1);
    }
    else if (iVar10 == 0x4000003e) {
      y_1 = CONCAT22(0x12,(ushort)y_1);
    }
    else if (iVar10 == 0x4000003f) {
      y_1 = CONCAT22(0x13,(ushort)y_1);
    }
    else if (iVar10 == 0x40000040) {
      y_1 = CONCAT22(0x14,(ushort)y_1);
    }
    else if (iVar10 == 0x40000041) {
      y_1 = CONCAT22(0x15,(ushort)y_1);
    }
    else if (iVar10 == 0x40000042) {
      y_1 = CONCAT22(0x16,(ushort)y_1);
    }
    else if (iVar10 == 0x40000043) {
      y_1 = CONCAT22(0x17,(ushort)y_1);
    }
    else if (iVar10 == 0x40000044) {
      y_1 = CONCAT22(0x18,(ushort)y_1);
    }
    else if (iVar10 == 0x40000045) {
      y_1 = CONCAT22(0x19,(ushort)y_1);
    }
    else if (iVar10 == 0x4000004a) {
      y_1 = CONCAT22(3,(ushort)y_1);
    }
    else if (iVar10 == 0x4000004b) {
      y_1 = CONCAT22(2,(ushort)y_1);
    }
    else if (iVar10 == 0x4000004d) {
      y_1 = CONCAT22(4,(ushort)y_1);
    }
    else if (iVar10 == 0x4000004e) {
      y_1 = CONCAT22(1,(ushort)y_1);
    }
    else if (iVar10 == 0x4000004f) {
      y_1 = CONCAT22(6,(ushort)y_1);
    }
    else if (iVar10 == 0x40000050) {
      y_1 = CONCAT22(5,(ushort)y_1);
    }
    else if (iVar10 == 0x40000051) {
      y_1 = CONCAT22(10,(ushort)y_1);
    }
    else if (iVar10 == 0x40000052) {
      y_1 = CONCAT22(0xb,(ushort)y_1);
    }
    else if (iVar10 == 0x40000058) {
      y_1 = CONCAT22(0xd,(ushort)y_1);
    }
    else if ((sev->window).data2 < 0x100) {
      y_1 = CONCAT22((short)(sev->window).data2,(ushort)y_1);
    }
    if (0x7f < y_1._2_2_) {
      return;
    }
    iVar10 = toupper((int)y_1._2_2_);
    y_1 = CONCAT22((short)iVar10,(ushort)y_1);
    D_PostEvent((event_t *)&y_1);
    return;
  }
  if (UVar1 == 0x303) {
    if (!GUICapture) {
      return;
    }
    y_1 = CONCAT22((short)(sev->edit).text[0],0x404);
    _y_1 = (ulong)(uint)y_1;
    D_PostEvent((event_t *)&y_1);
    return;
  }
  if (2 < UVar1 - 0x400) {
    if (UVar1 == 0x403) {
      if (GUICapture) {
        uVar7 = 0x11;
        if (0 < (sev->window).data2) {
          uVar7 = 0x10;
        }
        y_1._0_2_ = CONCAT11(uVar7,4);
        _y_1 = (ulong)(ushort)y_1;
        D_PostEvent((event_t *)&y_1);
        return;
      }
      uVar8 = 0x199;
      if (0 < (sev->window).data2) {
        uVar8 = 0x198;
      }
      y_1 = CONCAT22(uVar8,1);
      _y_1 = (ulong)(uint)y_1;
      D_PostEvent((event_t *)&y_1);
      y_1._0_1_ = '\x02';
      D_PostEvent((event_t *)&y_1);
      return;
    }
    if (1 < UVar1 - 0x603) {
      return;
    }
    bVar5 = 2;
    if (sev->type == 0x603) {
      bVar5 = 1;
    }
    sVar9 = (sev->display).event + 0x108;
    y_1._0_2_ = (ushort)bVar5;
    y_1 = CONCAT22(sVar9,(ushort)y_1);
    _y_1 = (ulong)(uint)y_1;
    if (sVar9 == 0) {
      return;
    }
    D_PostEvent((event_t *)&y_1);
    return;
  }
  if (((GUICapture) && ((sev->edit).text[4] != '\x04')) && ((sev->edit).text[4] != '\x05')) {
    if (sev->type != 0x400) {
      if ((sev->edit).text[4] == '\0') {
        return;
      }
      if (3 < (sev->button).button) {
        return;
      }
    }
    SDL_GetMouseState((long)&dik + 4,&dik);
    uVar4 = _y_1;
    y_1 = CONCAT22(dik._4_2_,(ushort)y_1);
    x_1._2_2_ = SUB82(uVar4,6);
    x_1._0_2_ = (SWORD)dik;
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2e])
              (screen,(long)&y_1 + 2,&x_1);
    if (sev->type == 0x400) {
      y_1._0_2_ = 0x604;
    }
    else {
      cVar6 = '\b';
      if (sev->type == 0x401) {
        cVar6 = '\a';
      }
      y_1._0_2_ = CONCAT11(cVar6 + ((sev->edit).text[4] + -1) * '\x03',4);
    }
    D_PostEvent((event_t *)&y_1);
    return;
  }
  if (sev->type == 0x400) {
    return;
  }
  bVar5 = 2 - (sev->type == 0x401);
  _y_1 = (ulong)bVar5;
  uVar3 = _y_1;
  if ((sev->button).button - 1 < 9) {
    y_1._0_2_ = (ushort)bVar5;
    switch((uint)(sev->button).button) {
    case 1:
      y_1 = CONCAT22(0x100,(ushort)y_1);
      _y_1 = (ulong)(uint)y_1;
      break;
    case 2:
      y_1 = CONCAT22(0x102,(ushort)y_1);
      _y_1 = (ulong)(uint)y_1;
      break;
    case 3:
      y_1 = CONCAT22(0x101,(ushort)y_1);
      _y_1 = (ulong)(uint)y_1;
      break;
    case 4:
      y_1 = CONCAT22(0x105,(ushort)y_1);
      _y_1 = (ulong)(uint)y_1;
      break;
    case 5:
      y_1 = CONCAT22(0x106,(ushort)y_1);
      _y_1 = (ulong)(uint)y_1;
      break;
    case 6:
      y_1 = CONCAT22(0x107,(ushort)y_1);
      _y_1 = (ulong)(uint)y_1;
      break;
    case 7:
      goto switchD_003498f2_caseD_7;
    case 8:
      y_1 = CONCAT22(0x103,(ushort)y_1);
      _y_1 = (ulong)(uint)y_1;
      break;
    case 9:
      y_1 = CONCAT22(0x104,(ushort)y_1);
      _y_1 = (ulong)(uint)y_1;
    }
  }
  else {
switchD_003498f2_caseD_7:
    pcVar2 = "pov1up";
    if (sev->type == 0x401) {
      pcVar2 = "pov1down";
    }
    _y_1 = uVar3;
    printf("SDL mouse button %s %d\n",pcVar2 + 4,(ulong)(sev->button).button);
  }
  if (y_1._2_2_ != 0) {
    D_PostEvent((event_t *)&y_1);
  }
  return;
}

Assistant:

void MessagePump (const SDL_Event &sev)
{
	static int lastx = 0, lasty = 0;
	int x, y;
	event_t event = { 0,0,0,0,0,0,0 };
	
	switch (sev.type)
	{
	case SDL_QUIT:
		exit (0);

	case SDL_WINDOWEVENT:
		switch (sev.window.event)
		{
			case SDL_WINDOWEVENT_FOCUS_GAINED:
			case SDL_WINDOWEVENT_FOCUS_LOST:
				S_SetSoundPaused(sev.window.event == SDL_WINDOWEVENT_FOCUS_GAINED);
				break;
		}
		break;

	case SDL_MOUSEBUTTONDOWN:
	case SDL_MOUSEBUTTONUP:
	case SDL_MOUSEMOTION:
		if (!GUICapture || sev.button.button == 4 || sev.button.button == 5)
		{
			if(sev.type != SDL_MOUSEMOTION)
			{
				event.type = sev.type == SDL_MOUSEBUTTONDOWN ? EV_KeyDown : EV_KeyUp;
				/* These button mappings work with my Gentoo system using the
				* evdev driver and a Logitech MX510 mouse. Whether or not they
				* carry over to other Linux systems, I have no idea, but I sure
				* hope so. (Though buttons 11 and 12 are kind of useless, since
				* they also trigger buttons 4 and 5.)
				*/
				switch (sev.button.button)
				{
				case SDL_BUTTON_LEFT:	event.data1 = KEY_MOUSE1;		break;
				case SDL_BUTTON_MIDDLE:	event.data1 = KEY_MOUSE3;		break;
				case SDL_BUTTON_RIGHT:	event.data1 = KEY_MOUSE2;		break;
				case 8:		event.data1 = KEY_MOUSE4;		break; // For whatever reason my side mouse buttons are here.
				case 9:		event.data1 = KEY_MOUSE5;		break;
				case SDL_BUTTON_X1:		event.data1 = KEY_MOUSE6;		break; // And these don't exist
				case SDL_BUTTON_X2:		event.data1 = KEY_MOUSE7;		break;
				case 6:		event.data1 = KEY_MOUSE8;		break;
				default:	printf("SDL mouse button %s %d\n",
					sev.type == SDL_MOUSEBUTTONDOWN ? "down" : "up", sev.button.button);	break;
				}
				if (event.data1 != 0)
				{
					D_PostEvent(&event);
				}
			}
		}
		else if (sev.type == SDL_MOUSEMOTION || (sev.button.button >= 1 && sev.button.button <= 3))
		{
			int x, y;
			SDL_GetMouseState (&x, &y);

			event.data1 = x;
			event.data2 = y;

			screen->ScaleCoordsFromWindow(event.data1, event.data2);

			event.type = EV_GUI_Event;
			if(sev.type == SDL_MOUSEMOTION)
				event.subtype = EV_GUI_MouseMove;
			else
			{
				event.subtype = sev.type == SDL_MOUSEBUTTONDOWN ? EV_GUI_LButtonDown : EV_GUI_LButtonUp;
				event.subtype += (sev.button.button - 1) * 3;
			}
			D_PostEvent(&event);
		}
		break;

	case SDL_MOUSEWHEEL:
		if (GUICapture)
		{
			event.type = EV_GUI_Event;
			event.subtype = sev.wheel.y > 0 ? EV_GUI_WheelUp : EV_GUI_WheelDown;
			D_PostEvent (&event);
		}
		else
		{
			event.type = EV_KeyDown;
			event.data1 = sev.wheel.y > 0 ? KEY_MWHEELUP : KEY_MWHEELDOWN;
			D_PostEvent (&event);
			event.type = EV_KeyUp;
			D_PostEvent (&event);
		}
		break;

	case SDL_KEYDOWN:
	case SDL_KEYUP:
		if (!GUICapture)
		{
			event.type = sev.type == SDL_KEYDOWN ? EV_KeyDown : EV_KeyUp;

			// Try to look up our key mapped key for conversion to DirectInput.
			// If that fails, then we'll do a lookup against the scan code,
			// which may not return the right key, but at least the key should
			// work in the game.
			if (const BYTE *dik = KeySymToDIK.CheckKey (sev.key.keysym.sym))
				event.data1 = *dik;
			else if (const BYTE *dik = KeyScanToDIK.CheckKey (sev.key.keysym.scancode))
				event.data1 = *dik;

			if (event.data1)
			{
				if (sev.key.keysym.sym < 256)
				{
					event.data2 = sev.key.keysym.sym;
				}
				D_PostEvent (&event);
			}
		}
		else
		{
			event.type = EV_GUI_Event;
			event.subtype = sev.type == SDL_KEYDOWN ? EV_GUI_KeyDown : EV_GUI_KeyUp;
			event.data3 = ((sev.key.keysym.mod & KMOD_SHIFT) ? GKM_SHIFT : 0) |
						  ((sev.key.keysym.mod & KMOD_CTRL) ? GKM_CTRL : 0) |
						  ((sev.key.keysym.mod & KMOD_ALT) ? GKM_ALT : 0);

			if (event.subtype == EV_GUI_KeyDown)
			{
				if (DownState[sev.key.keysym.scancode])
				{
					event.subtype = EV_GUI_KeyRepeat;
				}
				DownState[sev.key.keysym.scancode] = 1;
			}
			else
			{
				DownState[sev.key.keysym.scancode] = 0;
			}

			switch (sev.key.keysym.sym)
			{
			case SDLK_KP_ENTER:	event.data1 = GK_RETURN;	break;
			case SDLK_PAGEUP:	event.data1 = GK_PGUP;		break;
			case SDLK_PAGEDOWN:	event.data1 = GK_PGDN;		break;
			case SDLK_END:		event.data1 = GK_END;		break;
			case SDLK_HOME:		event.data1 = GK_HOME;		break;
			case SDLK_LEFT:		event.data1 = GK_LEFT;		break;
			case SDLK_RIGHT:	event.data1 = GK_RIGHT;		break;
			case SDLK_UP:		event.data1 = GK_UP;		break;
			case SDLK_DOWN:		event.data1 = GK_DOWN;		break;
			case SDLK_DELETE:	event.data1 = GK_DEL;		break;
			case SDLK_ESCAPE:	event.data1 = GK_ESCAPE;	break;
			case SDLK_F1:		event.data1 = GK_F1;		break;
			case SDLK_F2:		event.data1 = GK_F2;		break;
			case SDLK_F3:		event.data1 = GK_F3;		break;
			case SDLK_F4:		event.data1 = GK_F4;		break;
			case SDLK_F5:		event.data1 = GK_F5;		break;
			case SDLK_F6:		event.data1 = GK_F6;		break;
			case SDLK_F7:		event.data1 = GK_F7;		break;
			case SDLK_F8:		event.data1 = GK_F8;		break;
			case SDLK_F9:		event.data1 = GK_F9;		break;
			case SDLK_F10:		event.data1 = GK_F10;		break;
			case SDLK_F11:		event.data1 = GK_F11;		break;
			case SDLK_F12:		event.data1 = GK_F12;		break;
			default:
				if (sev.key.keysym.sym < 256)
				{
					event.data1 = sev.key.keysym.sym;
				}
				break;
			}
			if (event.data1 < 128)
			{
				event.data1 = toupper(event.data1);
				D_PostEvent (&event);
			}
		}
		break;

	case SDL_TEXTINPUT:
		if (GUICapture)
		{
			event.type = EV_GUI_Event;
			event.subtype = EV_GUI_Char;
			event.data1 = sev.text.text[0];
			D_PostEvent (&event);
		}
		break;

	case SDL_JOYBUTTONDOWN:
	case SDL_JOYBUTTONUP:
		event.type = sev.type == SDL_JOYBUTTONDOWN ? EV_KeyDown : EV_KeyUp;
		event.data1 = KEY_FIRSTJOYBUTTON + sev.jbutton.button;
		if(event.data1 != 0)
			D_PostEvent(&event);
		break;
	}
}